

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O0

pointer_type
cppcms::impl::
mfunc_to_io_handler<cppcms::impl::cgi::connection,std::shared_ptr<cppcms::impl::cgi::connection>,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>const&,cppcms::http::context*,booster::callback<void(cppcms::http::context::completion_type)>>
          (offset_in_connection_to_subr f,shared_ptr<cppcms::impl::cgi::connection> *s,context **p1,
          callback<void_(cppcms::http::context::completion_type)> *p2)

{
  context **p1_00;
  callback<void_(cppcms::http::context::completion_type)> *in_RCX;
  callable<void_(const_std::error_code_&,_unsigned_long)> *in_RDI;
  io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
  *in_R9;
  callable<void_(const_std::error_code_&,_unsigned_long)> *p;
  shared_ptr<cppcms::impl::cgi::connection> *in_stack_ffffffffffffffb0;
  offset_in_connection_to_subr *in_stack_ffffffffffffffb8;
  
  p = in_RDI;
  p1_00 = (context **)operator_new(0x40);
  io_handler_binder_p2<void_(cppcms::impl::cgi::connection::*)(const_std::error_code_&,_unsigned_long,_cppcms::http::context_*,_const_booster::callback<void_(cppcms::http::context::completion_type)>_&),_std::shared_ptr<cppcms::impl::cgi::connection>,_cppcms::http::context_*,_booster::callback<void_(cppcms::http::context::completion_type)>_>
  ::io_handler_binder_p2(in_R9,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,p1_00,in_RCX);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_>::
  intrusive_ptr((intrusive_ptr<booster::callable<void_(const_std::error_code_&,_unsigned_long)>_> *)
                in_RCX,p,SUB81((ulong)in_RDI >> 0x38,0));
  return (pointer_type)p;
}

Assistant:

booster::aio::io_handler::pointer_type mfunc_to_io_handler(void (C::*f)(booster::system::error_code const &,size_t,P1,P2),S s,P1in const &p1,P2in const &p2)
{
	return new io_handler_binder_p2<void (C::*)(booster::system::error_code const &,size_t,P1,P2),S,P1in,P2in>(f,s,p1,p2);
}